

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeBidirectionalLSTMLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t val;
  uint64 uVar1;
  mapped_type *pmVar2;
  LogMessage *pLVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  LayerUnion LVar6;
  LSTMParams *pLVar7;
  ShapeRange *other;
  mapped_type *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *pmVar8;
  LogFinisher local_3b1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_3b0;
  LogMessage local_3a8;
  mapped_type *local_370;
  mapped_type *local_368;
  mapped_type *local_360;
  mapped_type *local_358;
  mapped_type *local_350;
  uint64 local_348;
  LogMessage local_340;
  LogMessage local_308;
  LogMessage local_2d0;
  LogMessage local_298;
  LogMessage local_260;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_340,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_340,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_340);
  }
  pmVar8 = &this->blobShapes;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](pmVar8,(key_type *)
                               ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_308,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_308,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_308);
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](pmVar8,(key_type *)
                               ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_2d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_2d0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
  }
  ShapeConstraint::setName
            (pmVar5,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_3b0 = pmVar8;
  if (specLayer->_oneof_case_[0] == 0x1ae) {
    LVar6 = specLayer->layer_;
  }
  else {
    LVar6.bidirectionallstm_ = Specification::BiDirectionalLSTMLayerParams::default_instance();
  }
  val = (LVar6.bidirectionallstm_)->inputvectorsize_;
  uVar1 = (LVar6.bidirectionallstm_)->outputvectorsize_;
  ShapeConstraint::upperBoundSequence(pmVar4,10000);
  ShapeConstraint::setChannel(pmVar4,val);
  ShapeConstraint::setHeight(pmVar4,1);
  ShapeConstraint::setWidth(pmVar4,1);
  local_348 = uVar1;
  ShapeConstraint::setChannel(pmVar5,uVar1 * 2);
  ShapeConstraint::setHeight(pmVar5,1);
  ShapeConstraint::setWidth(pmVar5,1);
  pLVar7 = (LVar6.bidirectionallstm_)->params_;
  if (pLVar7 == (LSTMParams *)0x0) {
    pLVar7 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
  }
  if (pLVar7->sequenceoutput_ == true) {
    other = ShapeConstraint::sequenceRange(pmVar4);
    ShapeConstraint::updateSequenceRange(pmVar5,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar5,1);
  }
  pmVar8 = local_3b0;
  if (4 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_298,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_298,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_298);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar8,*(key_type **)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_260,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_260,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_260);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar8,*(key_type **)
                                  ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_228,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_228,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_228);
    }
    ShapeConstraint::setName
              (pmVar5,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 1));
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_1f0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
    }
    local_350 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](pmVar8,(key_type *)
                                    (specLayer->input_).super_RepeatedPtrFieldBase.rep_[1].elements
                                    [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_1b8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
    }
    local_360 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](pmVar8,(key_type *)
                                    (specLayer->output_).super_RepeatedPtrFieldBase.rep_[1].elements
                                    [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_180);
      pmVar8 = local_3b0;
    }
    ShapeConstraint::setName
              (local_360,
               (string *)(specLayer->output_).super_RepeatedPtrFieldBase.rep_[1].elements[0]);
    local_358 = pmVar4;
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_148);
    }
    local_370 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](pmVar8,*(key_type **)
                                     ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 2));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    local_368 = pmVar5;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar8,*(key_type **)
                                  ((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 2));
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    ShapeConstraint::setName
              (pmVar4,*(string **)((specLayer->output_).super_RepeatedPtrFieldBase.rep_ + 2));
    if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](pmVar8,(key_type *)
                                 (specLayer->input_).super_RepeatedPtrFieldBase.rep_[2].elements[0])
    ;
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3a8,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](pmVar8,(key_type *)
                                  (specLayer->output_).super_RepeatedPtrFieldBase.rep_[2].elements
                                  [0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 5) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_3a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar3 = google::protobuf::internal::LogMessage::operator<<
                         (&local_3a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_3b1,pLVar3);
      google::protobuf::internal::LogMessage::~LogMessage(&local_3a8);
    }
    ShapeConstraint::setName
              (this_00,(string *)(specLayer->output_).super_RepeatedPtrFieldBase.rep_[2].elements[0]
              );
    pmVar2 = local_358;
    ShapeConstraint::setSequence(local_358,1);
    uVar1 = local_348;
    ShapeConstraint::setChannel(pmVar2,local_348);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    pmVar2 = local_350;
    ShapeConstraint::setSequence(local_350,1);
    ShapeConstraint::setChannel(pmVar2,uVar1);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    pmVar2 = local_368;
    ShapeConstraint::setSequence(local_368,1);
    ShapeConstraint::setChannel(pmVar2,uVar1);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    pmVar2 = local_360;
    ShapeConstraint::setSequence(local_360,1);
    ShapeConstraint::setChannel(pmVar2,uVar1);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    pmVar2 = local_370;
    ShapeConstraint::setSequence(local_370,1);
    ShapeConstraint::setChannel(pmVar2,uVar1);
    ShapeConstraint::setHeight(pmVar2,1);
    ShapeConstraint::setWidth(pmVar2,1);
    ShapeConstraint::setSequence(pmVar5,1);
    ShapeConstraint::setChannel(pmVar5,uVar1);
    ShapeConstraint::setHeight(pmVar5,1);
    ShapeConstraint::setWidth(pmVar5,1);
    ShapeConstraint::setSequence(pmVar4,1);
    ShapeConstraint::setChannel(pmVar4,uVar1);
    ShapeConstraint::setHeight(pmVar4,1);
    ShapeConstraint::setWidth(pmVar4,1);
    ShapeConstraint::setSequence(this_00,1);
    ShapeConstraint::setChannel(this_00,uVar1);
    ShapeConstraint::setHeight(this_00,1);
    ShapeConstraint::setWidth(this_00,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBidirectionalLSTMLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::BiDirectionalLSTMLayerParams& recurrent = specLayer.bidirectionallstm();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    // This is the current maximum sequence length for bidirectional models.
    inputShape.upperBoundSequence(10000);
    
    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(2*outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.params().sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 5) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    ShapeConstraint& hiddenInShape = blobShapes[specLayer.input(2)];
    ShapeConstraint& hiddenOutShape = blobShapes[specLayer.output(2)];
    hiddenOutShape.setName(specLayer.output(2));

    ShapeConstraint& stateInShapeRev = blobShapes[specLayer.input(3)];
    ShapeConstraint& stateOutShapeRev = blobShapes[specLayer.output(3)];
    stateOutShapeRev.setName(specLayer.output(3));

    ShapeConstraint& hiddenInShapeRev = blobShapes[specLayer.input(4)];
    ShapeConstraint& hiddenOutShapeRev = blobShapes[specLayer.output(4)];
    hiddenOutShapeRev.setName(specLayer.output(4));


    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    hiddenInShape.setSequence(1);
    hiddenInShape.setChannel(outSize);
    hiddenInShape.setHeight(1);
    hiddenInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

    hiddenOutShape.setSequence(1);
    hiddenOutShape.setChannel(outSize);
    hiddenOutShape.setHeight(1);
    hiddenOutShape.setWidth(1);

    stateInShapeRev.setSequence(1);
    stateInShapeRev.setChannel(outSize);
    stateInShapeRev.setHeight(1);
    stateInShapeRev.setWidth(1);

    hiddenInShapeRev.setSequence(1);
    hiddenInShapeRev.setChannel(outSize);
    hiddenInShapeRev.setHeight(1);
    hiddenInShapeRev.setWidth(1);

    stateOutShapeRev.setSequence(1);
    stateOutShapeRev.setChannel(outSize);
    stateOutShapeRev.setHeight(1);
    stateOutShapeRev.setWidth(1);

    hiddenOutShapeRev.setSequence(1);
    hiddenOutShapeRev.setChannel(outSize);
    hiddenOutShapeRev.setHeight(1);
    hiddenOutShapeRev.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Bidirectional LSTM layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}